

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

void __thiscall
nlohmann::
basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>
::basic_json(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>
             *this,number_float_t val)

{
  bool bVar1;
  json_value local_20;
  number_float_t local_18;
  number_float_t val_local;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>
  *this_local;
  
  local_18 = val;
  val_local = (number_float_t)this;
  type_data_t::type_data_t((type_data_t *)this,number_float);
  json_value::json_value((json_value *)&(this->m_value).boolean,local_18);
  bVar1 = std::isfinite(local_18);
  if (!bVar1) {
    type_data_t::operator=((type_data_t *)this,null);
    memset(&local_20,0,8);
    this->m_value = local_20;
  }
  return;
}

Assistant:

basic_json(const number_float_t val) noexcept
                : m_type(value_t::number_float), m_value(val)
        {
            // replace infinity and NAN by null
            if (not std::isfinite(val))
            {
                m_type = value_t::null;
                m_value = json_value();
            }
        }